

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QSize __thiscall
QItemDelegate::sizeHint(QItemDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  QSize QVar1;
  QItemDelegatePrivate *this_00;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  QRect local_98;
  QRect local_88;
  QRect local_78;
  QRect local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,index,0xd);
  if (puStack_40 < (undefined1 *)0x4) {
    local_68 = rect(this,option,index,1);
    local_78 = rect(this,option,index,10);
    local_88 = QItemDelegatePrivate::displayRect(this_00,index,option,&local_68,&local_78);
    doLayout((QItemDelegate *)this_00,option,&local_78,&local_68,&local_88,true);
    local_98 = (QRect)QRect::operator|(&local_68,&local_88);
    auVar2 = QRect::operator|(&local_98,&local_78);
    QVar1.wd.m_i = (auVar2._8_4_ - auVar2._0_4_) + 1;
    QVar1.ht.m_i = (auVar2._12_4_ - auVar2._4_4_) + 1;
  }
  else {
    QVar1 = qvariant_cast<QSize>((QVariant *)&local_58);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSize QItemDelegate::sizeHint(const QStyleOptionViewItem &option,
                              const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    QVariant value = index.data(Qt::SizeHintRole);
    if (value.isValid())
        return qvariant_cast<QSize>(value);
    QRect decorationRect = rect(option, index, Qt::DecorationRole);
    QRect checkRect = rect(option, index, Qt::CheckStateRole);
    QRect displayRect = d->displayRect(index, option, decorationRect, checkRect);

    doLayout(option, &checkRect, &decorationRect, &displayRect, true);

    return (decorationRect|displayRect|checkRect).size();
}